

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_0::verifyImageYellowGreen(Surface *image,TestLog *log)

{
  ostringstream *this;
  uint uVar1;
  void *pvVar2;
  int y;
  int iVar3;
  size_t __n;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  bool bVar4;
  int iVar5;
  LogImageSet *this_00;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  allocator<char> local_34e;
  allocator<char> local_34d;
  allocator<char> local_34c;
  allocator<char> local_34b;
  allocator<char> local_34a;
  allocator<char> local_349;
  string local_348;
  string local_328;
  undefined1 local_308 [32];
  Surface error;
  string local_2d0;
  string local_2b0;
  string local_290;
  LogImageSet local_270;
  LogImage local_230;
  undefined1 local_1a0 [384];
  
  tcu::Surface::Surface(&error,image->m_width,image->m_height);
  bVar4 = true;
  __n = 0xff00ff00;
  for (iVar3 = 0; iVar3 < image->m_height; iVar3 = iVar3 + 1) {
    pvVar2 = (image->m_pixels).m_ptr;
    for (iVar5 = 0; iVar5 < image->m_width; iVar5 = iVar5 + 1) {
      uVar1 = *(uint *)((long)pvVar2 + (long)(image->m_width * iVar3 + iVar5) * 4);
      bVar7 = (~(uVar1 >> 8) & 0xff) < 0x15;
      bVar8 = (uVar1 & 0xff0000) < 0x140001;
      uVar6 = 0xff0000ff;
      if (bVar8 && bVar7) {
        uVar6 = 0xff00ff00;
      }
      *(undefined4 *)((long)error.m_pixels.m_ptr + (long)(error.m_width * iVar3 + iVar5) * 4) =
           uVar6;
      bVar4 = (bool)(bVar4 & (bVar8 && bVar7));
    }
  }
  iVar3 = (int)log;
  if (bVar4 == false) {
    this = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Image verification failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,"Verfication result",&local_34e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"Result of rendering",&local_349);
    tcu::LogImageSet::LogImageSet(&local_270,(string *)local_308,&local_328);
    tcu::LogImageSet::write(&local_270,iVar3,__buf_01,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Result",&local_34a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"Result",&local_34b);
    tcu::LogImage::LogImage
              ((LogImage *)local_1a0,&local_348,&local_290,image,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1a0,iVar3,__buf_02,(size_t)image);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"ErrorMask",&local_34c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Error mask",&local_34d)
    ;
    surface = &error;
    tcu::LogImage::LogImage(&local_230,&local_2b0,&local_2d0,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_230,iVar3,__buf_03,(size_t)surface);
    tcu::TestLog::endImageSet(log);
    tcu::LogImage::~LogImage(&local_230);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    tcu::LogImage::~LogImage((LogImage *)local_1a0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_348);
    tcu::LogImageSet::~LogImageSet(&local_270);
    std::__cxx11::string::~string((string *)&local_328);
    this_00 = (LogImageSet *)local_308;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Verfication result",(allocator<char> *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,"Result of rendering",(allocator<char> *)&local_2b0);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_230,&local_270.m_name,(string *)local_308);
    tcu::LogImageSet::write((LogImageSet *)&local_230,iVar3,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"Result",(allocator<char> *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Result",&local_34e);
    tcu::LogImage::LogImage
              ((LogImage *)local_1a0,&local_328,&local_348,image,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1a0,iVar3,__buf_00,(size_t)image);
    tcu::TestLog::endImageSet(log);
    tcu::LogImage::~LogImage((LogImage *)local_1a0);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_328);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_230);
    std::__cxx11::string::~string((string *)local_308);
    this_00 = &local_270;
  }
  std::__cxx11::string::~string((string *)this_00);
  tcu::Surface::~Surface(&error);
  return bVar4;
}

Assistant:

static bool verifyImageYellowGreen (const tcu::Surface& image, tcu::TestLog& log)
{
	using tcu::TestLog;

	const int colorThreshold	= 20;

	tcu::Surface error			(image.getWidth(), image.getHeight());
	bool isOk					= true;

	for (int y = 0; y < image.getHeight(); y++)
	for (int x = 0; x < image.getWidth(); x++)
	{
		const tcu::RGBA pixel = image.getPixel(x, y);
		bool pixelOk = true;

		// Any pixel with !(G ~= 255) is faulty (not a linear combinations of green and yellow)
		if (de::abs(pixel.getGreen() - 255) > colorThreshold)
			pixelOk = false;

		// Any pixel with !(B ~= 0) is faulty (not a linear combinations of green and yellow)
		if (de::abs(pixel.getBlue() - 0) > colorThreshold)
			pixelOk = false;

		error.setPixel(x, y, (pixelOk) ? (tcu::RGBA(0, 255, 0, 255)) : (tcu::RGBA(255, 0, 0, 255)));
		isOk = isOk && pixelOk;
	}

	if (!isOk)
	{
		log << TestLog::Message << "Image verification failed." << TestLog::EndMessage;
		log << TestLog::ImageSet("Verfication result", "Result of rendering")
			<< TestLog::Image("Result",		"Result",		image)
			<< TestLog::Image("ErrorMask",	"Error mask",	error)
			<< TestLog::EndImageSet;
	}
	else
	{
		log << TestLog::ImageSet("Verfication result", "Result of rendering")
			<< TestLog::Image("Result", "Result", image)
			<< TestLog::EndImageSet;
	}

	return isOk;
}